

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

void __thiscall OpenMD::CubicSpline::generate(CubicSpline *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  size_type sVar10;
  reference pvVar11;
  long in_RDI;
  __type _Var12;
  int i_3;
  int k_1;
  int k;
  int i_2;
  int i_1;
  vector<int,_std::allocator<int>_> p_1;
  int i;
  bool sorted;
  RealType h;
  RealType p;
  RealType fpn;
  RealType fp1;
  int in_stack_fffffffffffffc5c;
  double in_stack_fffffffffffffc60;
  value_type vVar13;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc70;
  value_type vVar14;
  size_type in_stack_fffffffffffffc78;
  double dVar15;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc80;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffca8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  double dVar16;
  CubicSpline *in_stack_fffffffffffffcb8;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = 0.0;
  sVar10 = std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28));
  *(int *)(in_RDI + 0x20) = (int)sVar10;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  bVar9 = true;
  for (local_30 = 1; local_30 < *(int *)(in_RDI + 0x20); local_30 = local_30 + 1) {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)local_30);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                         (long)(local_30 + -1));
    if (dVar1 - *pvVar11 <= 0.0) {
      bVar9 = false;
    }
  }
  if (!bVar9) {
    sort_permutation(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    apply_permutation(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffc70);
    apply_permutation(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffc70);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70);
  }
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),1);
  dVar1 = *pvVar11;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
  dVar15 = *pvVar11;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
  *pvVar11 = dVar1 - dVar15;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),1);
  dVar1 = *pvVar11;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),0);
  dVar15 = *pvVar11;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
  dVar16 = *pvVar11;
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
  *pvVar11 = (dVar1 - dVar15) / dVar16;
  if (*(int *)(in_RDI + 0x20) == 2) {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
    *pvVar11 = 0.0;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
    _Var12 = std::pow<double,int>(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
    *pvVar11 = _Var12 * -3.0;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
    _Var12 = std::pow<double,int>(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),0);
    *pvVar11 = _Var12 * -2.0;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
    vVar13 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),1);
    *pvVar11 = vVar13;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),1);
    *pvVar11 = 0.0;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),1);
    *pvVar11 = 0.0;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),1);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
    *(double *)(in_RDI + 0x10) = 1.0 / (dVar1 - *pvVar11);
    *(undefined1 *)(in_RDI + 8) = 1;
    *(undefined1 *)(in_RDI + 9) = 1;
  }
  else {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),0);
    *pvVar11 = dVar1 * 2.0;
    for (local_8c = 1; local_8c < *(int *)(in_RDI + 0x20) + -1; local_8c = local_8c + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                           (long)(local_8c + 1));
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)local_8c
                          );
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_8c
                          );
      *pvVar11 = dVar1 - dVar15;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_8c
                          );
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
      if (1e-05 < ABS(dVar1 - dVar15) / *pvVar11) {
        *(undefined1 *)(in_RDI + 8) = 0;
      }
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                           (long)(local_8c + 1));
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_8c
                          );
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_8c
                          );
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_8c
                          );
      *pvVar11 = (dVar1 - dVar15) / dVar16;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_8c
                          );
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(local_8c + -1));
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_8c
                          );
      *pvVar11 = (dVar1 + dVar15) * 2.0;
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    *pvVar11 = dVar1 * 2.0;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
    local_10 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),1);
    dVar15 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
    dVar16 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
    dVar2 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),1);
    local_10 = local_10 - (dVar1 * (dVar15 - dVar16)) / (dVar2 + *pvVar11);
    if (3 < *(int *)(in_RDI + 0x20)) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),0);
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),1);
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),2);
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),1);
      dVar3 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),1);
      dVar4 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),2);
      dVar5 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),1);
      dVar6 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
      dVar7 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),3);
      dVar8 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
      local_10 = local_10 +
                 (dVar1 * ((((dVar15 + dVar16) * (dVar2 - dVar3)) / (dVar4 + dVar5) - dVar6) + dVar7
                          )) / (dVar8 - *pvVar11);
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    local_18 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    dVar15 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -3));
    dVar16 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -3));
    dVar2 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    local_18 = local_18 + (dVar1 * (dVar15 - dVar16)) / (dVar2 + *pvVar11);
    if (3 < *(int *)(in_RDI + 0x20)) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(*(int *)(in_RDI + 0x20) + -2));
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(*(int *)(in_RDI + 0x20) + -2));
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(*(int *)(in_RDI + 0x20) + -3));
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(*(int *)(in_RDI + 0x20) + -3));
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(*(int *)(in_RDI + 0x20) + -2));
      dVar3 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(*(int *)(in_RDI + 0x20) + -3));
      dVar4 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(*(int *)(in_RDI + 0x20) + -4));
      dVar5 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(*(int *)(in_RDI + 0x20) + -3));
      dVar6 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(*(int *)(in_RDI + 0x20) + -4));
      dVar7 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                           (long)(*(int *)(in_RDI + 0x20) + -1));
      dVar8 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                           (long)(*(int *)(in_RDI + 0x20) + -4));
      local_18 = local_18 +
                 (dVar1 * ((dVar15 - dVar16) - ((dVar2 + dVar3) * (dVar4 - dVar5)) / (dVar6 + dVar7)
                          )) / (dVar8 - *pvVar11);
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    *pvVar11 = (local_18 - dVar1) * 3.0;
    for (local_90 = *(int *)(in_RDI + 0x20) + -2; 0 < local_90; local_90 = local_90 + -1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_90
                          );
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(local_90 + -1));
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_90
                          );
      *pvVar11 = (dVar1 - dVar15) * 3.0;
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),0);
    *pvVar11 = (dVar1 - local_10) * 3.0;
    for (local_94 = 1; local_94 < *(int *)(in_RDI + 0x20); local_94 = local_94 + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(local_94 + -1));
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                           (long)(local_94 + -1));
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_94
                          );
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                           (long)(local_94 + -1));
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_94
                          );
      *pvVar11 = -(dVar1 / dVar15) * dVar2 + dVar16;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_94
                          );
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(local_94 + -1));
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_94
                          );
      *pvVar11 = -(dVar1 / dVar15) * dVar2 + dVar16;
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    dVar15 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    *pvVar11 = dVar1 / dVar15;
    for (local_98 = *(int *)(in_RDI + 0x20) + -2; -1 < local_98; local_98 = local_98 + -1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_98
                          );
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_98
                          );
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(local_98 + 1));
      dVar16 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_98
                          );
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_98
                          );
      *pvVar11 = (-dVar15 * dVar16 + dVar1) / dVar2;
    }
    for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x20) + -1; local_9c = local_9c + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                           (long)(local_9c + 1));
      local_28 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)local_9c
                          );
      local_28 = local_28 - *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                           (long)(local_9c + 1));
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_9c
                          );
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_9c
                          );
      *pvVar11 = (dVar1 - dVar15) / (local_28 * 3.0);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                           (long)(local_9c + 1));
      vVar13 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_9c
                          );
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)local_9c
                          );
      vVar14 = *pvVar11;
      dVar16 = local_28;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)local_9c
                          );
      dVar15 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_9c
                          );
      *pvVar11 = -local_28 * (dVar16 * dVar15 + vVar14) + (vVar13 - dVar1) / local_28;
    }
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    vVar13 = *pvVar11;
    dVar15 = local_28;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    vVar14 = *pvVar11;
    local_28 = local_28 * 3.0;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                         (long)(*(int *)(in_RDI + 0x20) + -2));
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                         (long)(*(int *)(in_RDI + 0x20) + -1));
    *pvVar11 = dVar15 * (vVar14 + vVar14 + local_28 * dVar1) + vVar13;
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),1);
      vVar13 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
      *(double *)(in_RDI + 0x10) = 1.0 / (vVar13 - *pvVar11);
    }
    *(undefined1 *)(in_RDI + 9) = 1;
  }
  return;
}

Assistant:

void CubicSpline::generate() {
    // Calculate coefficients defining a smooth cubic interpolatory spline.
    //
    // class values constructed:
    //   n   = number of data_ points.
    //   x_  = vector of independent variable values
    //   y_  = vector of dependent variable values
    //   b   = vector of S'(x_[i]) values.
    //   c   = vector of S"(x_[i])/2 values.
    //   d   = vector of S'''(x_[i]+)/6 values (i < n).
    // Local variables:

    RealType fp1, fpn, p;
    RealType h(0.0);

    // make sure the sizes match

    n = x_.size();
    b.resize(n);
    c.resize(n);
    d.resize(n);

    // make sure we are monotonically increasing in x:

    bool sorted = true;

    for (int i = 1; i < n; i++) {
      if ((x_[i] - x_[i - 1]) <= 0.0) sorted = false;
    }

    // sort if necessary

    if (!sorted) {
      std::vector<int> p = sort_permutation(x_);
      x_                 = apply_permutation(x_, p);
      y_                 = apply_permutation(y_, p);
    }

    // Calculate coefficients for the tridiagonal system: store
    // sub-diagonal in B, diagonal in D, difference quotient in C.

    b[0] = x_[1] - x_[0];
    c[0] = (y_[1] - y_[0]) / b[0];

    if (n == 2) {
      // Assume the derivatives at both endpoints are zero. Another
      // assumption could be made to have a linear interpolant between
      // the two points.  In that case, the b coefficients below would be
      // (y_[1] - y_[0]) / (x_[1] - x_[0])
      // and the c and d coefficients would both be zero.
      b[0]      = 0.0;
      c[0]      = -3.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 2);
      d[0]      = -2.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 3);
      b[1]      = b[0];
      c[1]      = 0.0;
      d[1]      = 0.0;
      dx        = 1.0 / (x_[1] - x_[0]);
      isUniform = true;
      generated = true;
      return;
    }

    d[0] = 2.0 * b[0];

    for (int i = 1; i < n - 1; i++) {
      b[i] = x_[i + 1] - x_[i];
      if (fabs(b[i] - b[0]) / b[0] > 1.0e-5) isUniform = false;
      c[i] = (y_[i + 1] - y_[i]) / b[i];
      d[i] = 2.0 * (b[i] + b[i - 1]);
    }

    d[n - 1] = 2.0 * b[n - 2];

    // Calculate estimates for the end slopes using polynomials
    // that interpolate the data_ nearest the end.

    fp1 = c[0] - b[0] * (c[1] - c[0]) / (b[0] + b[1]);
    if (n > 3)
      fp1 = fp1 +
            b[0] *
                ((b[0] + b[1]) * (c[2] - c[1]) / (b[1] + b[2]) - c[1] + c[0]) /
                (x_[3] - x_[0]);

    fpn = c[n - 2] + b[n - 2] * (c[n - 2] - c[n - 3]) / (b[n - 3] + b[n - 2]);

    if (n > 3)
      fpn = fpn + b[n - 2] *
                      (c[n - 2] - c[n - 3] -
                       (b[n - 3] + b[n - 2]) * (c[n - 3] - c[n - 4]) /
                           (b[n - 3] + b[n - 4])) /
                      (x_[n - 1] - x_[n - 4]);

    // Calculate the right hand side and store it in C.

    c[n - 1] = 3.0 * (fpn - c[n - 2]);
    for (int i = n - 2; i > 0; i--)
      c[i] = 3.0 * (c[i] - c[i - 1]);
    c[0] = 3.0 * (c[0] - fp1);

    // Solve the tridiagonal system.

    for (int k = 1; k < n; k++) {
      p    = b[k - 1] / d[k - 1];
      d[k] = d[k] - p * b[k - 1];
      c[k] = c[k] - p * c[k - 1];
    }

    c[n - 1] = c[n - 1] / d[n - 1];

    for (int k = n - 2; k >= 0; k--)
      c[k] = (c[k] - b[k] * c[k + 1]) / d[k];

    // Calculate the coefficients defining the spline.

    for (int i = 0; i < n - 1; i++) {
      h    = x_[i + 1] - x_[i];
      d[i] = (c[i + 1] - c[i]) / (3.0 * h);
      b[i] = (y_[i + 1] - y_[i]) / h - h * (c[i] + h * d[i]);
    }

    b[n - 1] = b[n - 2] + h * (2.0 * c[n - 2] + h * 3.0 * d[n - 2]);

    if (isUniform) dx = 1.0 / (x_[1] - x_[0]);

    generated = true;
    return;
  }